

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

BigNumber * operator/(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint length;
  reference pvVar4;
  BigNumber local_188;
  BigNumber local_168;
  BigNumber local_148;
  BigNumber local_128;
  BigNumber local_108;
  BigNumber local_e8;
  uint local_c8;
  int local_c4;
  uint i_1;
  uint local_bc;
  uint i;
  uint quotient_size;
  BigNumber local_98;
  BigNumber local_78;
  undefined1 local_48 [8];
  BigNumber val;
  BigNumber *nb2_local;
  BigNumber *nb1_local;
  BigNumber *quotient;
  
  val.m_base._7_1_ = 0;
  BigNumber::BigNumber(__return_storage_ptr__,nb1->m_base);
  uVar2 = Polynome::m_degre(&nb1->super_Polynome);
  uVar3 = Polynome::m_degre(&nb2->super_Polynome);
  length = Polynome::m_degre(&nb2->super_Polynome);
  BigNumber::m_slice((BigNumber *)local_48,nb1,uVar2 - uVar3,length);
  bVar1 = operator>(nb2,(BigNumber *)local_48);
  if (bVar1) {
    BigNumber::operator>>((BigNumber *)local_48,1);
    BigNumber::BigNumber(&local_98,(BigNumber *)local_48);
    uVar2 = Polynome::m_degre(&nb1->super_Polynome);
    uVar3 = Polynome::m_degre(&nb2->super_Polynome);
    BigNumber::m_slice((BigNumber *)&i,nb1,~uVar3 + uVar2,1);
    operator+(&local_78,&local_98,(BigNumber *)&i);
    BigNumber::operator=((BigNumber *)local_48,&local_78);
    BigNumber::~BigNumber(&local_78);
    BigNumber::~BigNumber((BigNumber *)&i);
    BigNumber::~BigNumber(&local_98);
  }
  uVar2 = Polynome::m_degre(&nb1->super_Polynome);
  local_bc = Polynome::m_degre((Polynome *)local_48);
  local_bc = uVar2 - local_bc;
  for (i_1 = 0; i_1 < local_bc; i_1 = i_1 + 1) {
    local_c4 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
               &local_c4);
  }
  for (local_c8 = 0; local_c8 < local_bc + 1; local_c8 = local_c8 + 1) {
    while (bVar1 = operator>=((BigNumber *)local_48,nb2), bVar1) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          __return_storage_ptr__,(ulong)(local_bc - local_c8));
      *pvVar4 = *pvVar4 + 1;
      BigNumber::BigNumber(&local_108,(BigNumber *)local_48);
      BigNumber::BigNumber(&local_128,nb2);
      operator-(&local_e8,&local_108,&local_128);
      BigNumber::operator=((BigNumber *)local_48,&local_e8);
      BigNumber::~BigNumber(&local_e8);
      BigNumber::~BigNumber(&local_128);
      BigNumber::~BigNumber(&local_108);
    }
    BigNumber::operator>>((BigNumber *)local_48,1);
    BigNumber::BigNumber(&local_168,(BigNumber *)local_48);
    BigNumber::m_slice(&local_188,nb1,~local_c8 + local_bc,1);
    operator+(&local_148,&local_168,&local_188);
    BigNumber::operator=((BigNumber *)local_48,&local_148);
    BigNumber::~BigNumber(&local_148);
    BigNumber::~BigNumber(&local_188);
    BigNumber::~BigNumber(&local_168);
  }
  val.m_base._7_1_ = 1;
  BigNumber::~BigNumber((BigNumber *)local_48);
  if ((val.m_base._7_1_ & 1) == 0) {
    BigNumber::~BigNumber(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber operator / (BigNumber nb1, BigNumber nb2) {
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();

    BigNumber quotient(nb1.m_base);
    BigNumber val = nb1.m_slice(nb1.m_degre() - nb2.m_degre(), nb2.m_degre());

    if(nb2 > val){
        val >> 1;
        val = val + nb1.m_slice(nb1.m_degre() - nb2.m_degre() - 1, 1);
    }

    unsigned int quotient_size = nb1.m_degre() - val.m_degre();

    for(unsigned int i = 0; i < quotient_size; i++){
        quotient.m_coef.emplace_back(0);
    }

    for(unsigned int i = 0; i < quotient_size + 1; i++){
        while(val >= nb2){
            quotient.m_coef[quotient_size - i] += 1;
            val = val - nb2;
        }
        val >> 1;
        val = val + nb1.m_slice(quotient_size - i - 1, 1);
    }
//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << " Division : " << (t2 - t1)/(float)cmp << endl;
    return quotient;
}